

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive_ascii.c
# Opt level: O0

void * receiver(void *_)

{
  bool bVar1;
  size_t sVar2;
  uint local_74;
  uint local_64;
  size_t d_2;
  int i_1;
  size_t d_1;
  int j;
  size_t d;
  int local_30;
  int preamble_counter;
  int i;
  uint32_t nanosecs;
  timespec t0;
  void *__local;
  
  t0.tv_nsec = (__syscall_slong_t)_;
  clock_gettime(1,(timespec *)&i);
  local_30 = 0;
  d._4_4_ = 0;
  do {
    sched_yield();
    sVar2 = (*meassure)((_func_void *)0x11d098);
    if (method == 0) {
      bVar1 = sVar2 <= threshhold;
    }
    else {
      bVar1 = threshhold < sVar2;
    }
    local_64 = (uint)bVar1;
    if (d._4_4_ < 7) {
      if (local_64 == d._4_4_ % 2) {
        d._4_4_ = 0;
      }
      else {
        d._4_4_ = d._4_4_ + 1;
      }
    }
    else {
      if (local_64 == 1) {
        preamble_counter = (int)interval + (int)t0.tv_sec;
        if (999999999 < (uint)preamble_counter) {
          preamble_counter = preamble_counter + 0xc4653600;
          _i = _i + 1;
        }
        t0.tv_sec = (__time_t)(uint)preamble_counter;
        clock_nanosleep(1,1,(timespec *)&i,(timespec *)0x0);
        for (d_1._4_4_ = 0; d_1._4_4_ < 0x70; d_1._4_4_ = d_1._4_4_ + 1) {
          sched_yield();
          sVar2 = (*meassure)((_func_void *)0x11d098);
          frame.mac_addr[d_1._4_4_] = sVar2;
          preamble_counter = (int)interval + (int)t0.tv_sec;
          if (999999999 < (uint)preamble_counter) {
            preamble_counter = preamble_counter + 0xc4653600;
            _i = _i + 1;
          }
          t0.tv_sec = (__time_t)(uint)preamble_counter;
          clock_nanosleep(1,1,(timespec *)&i,(timespec *)0x0);
        }
        for (d_2._4_4_ = 0; d_2._4_4_ < 0x10; d_2._4_4_ = d_2._4_4_ + 1) {
          if (method == 0) {
            bVar1 = frame.length[d_2._4_4_] <= threshhold;
          }
          else {
            bVar1 = threshhold < frame.length[d_2._4_4_];
          }
          local_74 = (uint)bVar1;
          length = (long)(int)(local_74 << (0xfU - (char)d_2._4_4_ & 0x1f)) | length;
        }
        if ((length < 0x5dd) && (0x2d < length)) {
          while( true ) {
            sched_yield();
            sVar2 = (*meassure)((_func_void *)0x11d098);
            frame.payload[local_30] = sVar2;
            if ((long)(local_30 + 1) == length) break;
            preamble_counter = (int)interval + (int)t0.tv_sec;
            if (999999999 < (uint)preamble_counter) {
              preamble_counter = preamble_counter + 0xc4653600;
              _i = _i + 1;
            }
            t0.tv_sec = (__time_t)(uint)preamble_counter;
            clock_nanosleep(1,1,(timespec *)&i,(timespec *)0x0);
            local_30 = local_30 + 1;
          }
        }
        else {
          length = 0;
        }
        return (void *)0x0;
      }
      d._4_4_ = d._4_4_ + -2;
    }
    preamble_counter = (int)interval + (int)t0.tv_sec;
    if (999999999 < (uint)preamble_counter) {
      preamble_counter = preamble_counter + 0xc4653600;
      _i = _i + 1;
    }
    t0.tv_sec = (__time_t)(uint)preamble_counter;
    clock_nanosleep(1,1,(timespec *)&i,(timespec *)0x0);
  } while( true );
}

Assistant:

void* receiver(void* _)
{
    INIT_CLOCK
    int i = 0;
    int preamble_counter = 0;
    while(1)
    {
        sched_yield();
        size_t d = meassure(function + 64);
        d = eval(d);

        if(preamble_counter < 0 * 8 + 7)
        {
            if(d == preamble_counter % 2)
            {
                // wrong sync bit
                preamble_counter = 0;
            }
            else
            {
                // correct sync bit
                preamble_counter++;
            }
        }
        else
        {
            if(d == 1)
            {
                // preamble done
                WAIT_FOR_CLOCK
                break;
            }
            else
            {
                // still in Sync
                preamble_counter -= 2;
            }
        }

        WAIT_FOR_CLOCK
    }

    for(int j = 0; j < (6 + 6 + 2) * 8; j++)
    {
        sched_yield();
        size_t d = meassure(function + 64);

        frame.mac_addr[j] = d;
        WAIT_FOR_CLOCK;
    }

    // retrieve length
    for(int i=0; i<16; i++)
    {
        length |= eval(frame.length[i])<<(15-i);
    }

    if(length > 1500 || length < 46)
    {
        // fprintf(stderr, "Length faulty: %d announced\n", length);
        length = 0;
        return NULL;        
    }

    while(1)
    {
        sched_yield();
        size_t d = meassure(function + 64);

        frame.payload[i++] = d;

        if(i == length)
            return NULL;

        WAIT_FOR_CLOCK
    }
}